

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

matches * atomname_a(iasctx *ctx,void *v,int spos)

{
  int iVar1;
  matches *pmVar2;
  
  if ((ctx->atomsnum != spos) && (ctx->atoms[spos]->type == LITEM_NAME)) {
    iVar1 = strcmp(ctx->atoms[spos]->str,(char *)v);
    if (iVar1 == 0) {
      pmVar2 = alwaysmatches(spos + 1);
      return pmVar2;
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomname_a APROTO {
	if (spos == ctx->atomsnum)
		return 0;
	struct litem *li = ctx->atoms[spos];
	if (li->type == LITEM_NAME && !strcmp(li->str, v))
		return alwaysmatches(spos+1);
	else
		return 0;
}